

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_switches.cpp
# Opt level: O1

void __thiscall FTextureManager::InitSwitchList(FTextureManager *this)

{
  char *__s1;
  int iVar1;
  FTextureID FVar2;
  FString in_RAX;
  FSwitchDef *def1;
  FSwitchDef *def2;
  char *__s2;
  FMemLump lumpdata;
  FMemLump local_38;
  FMemLump FVar3;
  
  local_38.Block.Chars = (FString)(FString)in_RAX.Chars;
  iVar1 = FWadCollection::CheckNumForName(&Wads,"SWITCHES",0);
  if (iVar1 != -1) {
    FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffc8,0xa861c0);
    FVar3.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
    if (*(int *)((long)local_38.Block.Chars + -0xc) != 0) {
      FVar3.Block.Chars = local_38.Block.Chars;
    }
    for (__s2 = (char *)((long)FVar3.Block.Chars + 9); (__s2[9] != '\0' || (__s2[10] != '\0'));
        __s2 = __s2 + 0x14) {
      __s1 = __s2 + -9;
      iVar1 = strcasecmp(__s1,__s2);
      if (iVar1 == 0) {
        Printf("Switch %s in SWITCHES has the same \'on\' state\n",__s1);
      }
      else {
        FVar2 = CheckForTexture(this,__s1,1,3);
        if (-1 < FVar2.texnum) {
          FVar2 = CheckForTexture(this,__s2,1,3);
          if (-1 < FVar2.texnum) {
            def1 = (FSwitchDef *)
                   M_Malloc_Dbg(0x20,
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/textures/anim_switches.cpp"
                                ,0x58);
            def2 = (FSwitchDef *)
                   M_Malloc_Dbg(0x20,
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/textures/anim_switches.cpp"
                                ,0x59);
            FVar2 = CheckForTexture(this,__s1,1,3);
            def2->frames[0].Texture.texnum = FVar2.texnum;
            (def1->PreTexture).texnum = FVar2.texnum;
            FVar2 = CheckForTexture(this,__s2,1,3);
            def1->frames[0].Texture.texnum = FVar2.texnum;
            (def2->PreTexture).texnum = FVar2.texnum;
            def2->Sound = 0;
            def1->Sound = 0;
            def2->NumFrames = 1;
            def1->NumFrames = 1;
            def2->frames[0].TimeMin = 0;
            def1->frames[0].TimeMin = 0;
            def2->frames[0].TimeRnd = 0;
            def1->frames[0].TimeRnd = 0;
            AddSwitchPair(this,def1,def2);
          }
        }
      }
    }
    FMemLump::~FMemLump(&stack0xffffffffffffffc8);
  }
  TArray<FSwitchDef_*,_FSwitchDef_*>::ShrinkToFit(&this->mSwitchDefs);
  qsort((this->mSwitchDefs).Array,(ulong)(this->mSwitchDefs).Count,8,SortSwitchDefs);
  return;
}

Assistant:

void FTextureManager::InitSwitchList ()
{
	const BITFIELD texflags = TEXMAN_Overridable | TEXMAN_TryAny;
	int lump = Wads.CheckNumForName ("SWITCHES");

	if (lump != -1)
	{
		FMemLump lumpdata = Wads.ReadLump (lump);
		const char *alphSwitchList = (const char *)lumpdata.GetMem();
		const char *list_p;
		FSwitchDef *def1, *def2;

		for (list_p = alphSwitchList; list_p[18] || list_p[19]; list_p += 20)
		{
			// [RH] Check for switches that aren't really switches
			if (stricmp (list_p, list_p+9) == 0)
			{
				Printf ("Switch %s in SWITCHES has the same 'on' state\n", list_p);
				continue;
			}
			// [RH] Skip this switch if its textures can't be found.
			if (CheckForTexture (list_p /* .name1 */, FTexture::TEX_Wall, texflags).Exists() &&
				CheckForTexture (list_p + 9 /* .name2 */, FTexture::TEX_Wall, texflags).Exists())
			{
				def1 = (FSwitchDef *)M_Malloc (sizeof(FSwitchDef));
				def2 = (FSwitchDef *)M_Malloc (sizeof(FSwitchDef));
				def1->PreTexture = def2->frames[0].Texture = CheckForTexture (list_p /* .name1 */, FTexture::TEX_Wall, texflags);
				def2->PreTexture = def1->frames[0].Texture = CheckForTexture (list_p + 9, FTexture::TEX_Wall, texflags);
				def1->Sound = def2->Sound = 0;
				def1->NumFrames = def2->NumFrames = 1;
				def1->frames[0].TimeMin = def2->frames[0].TimeMin = 0;
				def1->frames[0].TimeRnd = def2->frames[0].TimeRnd = 0;
				AddSwitchPair(def1, def2);
			}
		}
	}

	mSwitchDefs.ShrinkToFit ();
	qsort (&mSwitchDefs[0], mSwitchDefs.Size(), sizeof(FSwitchDef *), SortSwitchDefs);
}